

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O0

SuffixTreeInternalNode * __thiscall wasm::SuffixTree::insertRoot(SuffixTree *this)

{
  SuffixTreeInternalNode *pSVar1;
  SuffixTree *this_local;
  
  pSVar1 = insertInternalNode(this,(SuffixTreeInternalNode *)0x0,0xffffffff,0xffffffff,0);
  return pSVar1;
}

Assistant:

SuffixTreeInternalNode* SuffixTree::insertRoot() {
  return insertInternalNode(/*Parent = */ nullptr,
                            SuffixTreeNode::EmptyIdx,
                            SuffixTreeNode::EmptyIdx,
                            /*Edge = */ 0);
}